

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_perform_fetch(connectdata *conn)

{
  void *pvVar1;
  char *local_88;
  char *local_70;
  char *local_58;
  char *local_40;
  IMAP *imap;
  CURLcode result;
  connectdata *conn_local;
  
  pvVar1 = (conn->data->req).protop;
  if (*(long *)((long)pvVar1 + 0x18) == 0) {
    if (*(long *)((long)pvVar1 + 0x20) == 0) {
      Curl_failf(conn->data,"Cannot FETCH without a UID.");
      return CURLE_URL_MALFORMAT;
    }
    if (*(long *)((long)pvVar1 + 0x30) == 0) {
      if (*(long *)((long)pvVar1 + 0x28) == 0) {
        local_88 = "";
      }
      else {
        local_88 = *(char **)((long)pvVar1 + 0x28);
      }
      imap._4_4_ = imap_sendf(conn,"FETCH %s BODY[%s]",*(undefined8 *)((long)pvVar1 + 0x20),local_88
                             );
    }
    else {
      if (*(long *)((long)pvVar1 + 0x28) == 0) {
        local_70 = "";
      }
      else {
        local_70 = *(char **)((long)pvVar1 + 0x28);
      }
      imap._4_4_ = imap_sendf(conn,"FETCH %s BODY[%s]<%s>",*(undefined8 *)((long)pvVar1 + 0x20),
                              local_70,*(undefined8 *)((long)pvVar1 + 0x30));
    }
  }
  else if (*(long *)((long)pvVar1 + 0x30) == 0) {
    if (*(long *)((long)pvVar1 + 0x28) == 0) {
      local_58 = "";
    }
    else {
      local_58 = *(char **)((long)pvVar1 + 0x28);
    }
    imap._4_4_ = imap_sendf(conn,"UID FETCH %s BODY[%s]",*(undefined8 *)((long)pvVar1 + 0x18),
                            local_58);
  }
  else {
    if (*(long *)((long)pvVar1 + 0x28) == 0) {
      local_40 = "";
    }
    else {
      local_40 = *(char **)((long)pvVar1 + 0x28);
    }
    imap._4_4_ = imap_sendf(conn,"UID FETCH %s BODY[%s]<%s>",*(undefined8 *)((long)pvVar1 + 0x18),
                            local_40,*(undefined8 *)((long)pvVar1 + 0x30));
  }
  if (imap._4_4_ == CURLE_OK) {
    state(conn,IMAP_FETCH);
  }
  return imap._4_4_;
}

Assistant:

static CURLcode imap_perform_fetch(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct IMAP *imap = conn->data->req.protop;
  /* Check we have a UID */
  if(imap->uid) {

    /* Send the FETCH command */
    if(imap->partial)
      result = imap_sendf(conn, "UID FETCH %s BODY[%s]<%s>",
                            imap->uid,
                            imap->section ? imap->section : "",
                            imap->partial);
    else
      result = imap_sendf(conn, "UID FETCH %s BODY[%s]",
                            imap->uid,
                            imap->section ? imap->section : "");
  }
  else if(imap->mindex) {

    /* Send the FETCH command */
    if(imap->partial)
      result = imap_sendf(conn, "FETCH %s BODY[%s]<%s>",
                            imap->mindex,
                            imap->section ? imap->section : "",
                            imap->partial);
    else
      result = imap_sendf(conn, "FETCH %s BODY[%s]",
                            imap->mindex,
                            imap->section ? imap->section : "");
  }
  else {
        failf(conn->data, "Cannot FETCH without a UID.");
        return CURLE_URL_MALFORMAT;
  }
  if(!result)
    state(conn, IMAP_FETCH);

  return result;
}